

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

void __thiscall
helics::EndpointInfo::addMessage
          (EndpointInfo *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  _Elt_pointer puVar1;
  _Elt_pointer puVar2;
  _Elt_pointer puVar3;
  _Elt_pointer puVar4;
  _Map_pointer ppuVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  _TmpBuf __buf;
  handle handle;
  _Temporary_buffer<std::_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  local_c0;
  deque<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
  *local_a8;
  unique_lock<std::shared_mutex> local_a0;
  _Elt_pointer local_90;
  long local_88;
  undefined8 local_80;
  long local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Elt_pointer local_60;
  _Map_pointer local_58;
  _Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>
  local_50;
  
  local_a8 = (deque<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
              *)&this->message_queue;
  local_a0._M_device = &(this->message_queue).m_mutex;
  local_a0._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_a0);
  local_a0._M_owns = true;
  std::
  deque<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
  ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
            (local_a8,message);
  puVar1 = *(_Elt_pointer *)(local_a8 + 0x10);
  puVar2 = *(_Elt_pointer *)(local_a8 + 0x30);
  if (puVar1 != puVar2) {
    puVar3 = *(_Elt_pointer *)(local_a8 + 0x18);
    puVar4 = *(_Elt_pointer *)(local_a8 + 0x20);
    ppuVar5 = *(_Map_pointer *)(local_a8 + 0x28);
    lVar6 = *(long *)(local_a8 + 0x38);
    uVar7 = *(undefined8 *)(local_a8 + 0x40);
    lVar8 = *(long *)(local_a8 + 0x48);
    lVar9 = ((((ulong)(lVar8 - (long)ppuVar5) >> 3) - 1) + (ulong)(lVar8 == 0)) * 0x40;
    lVar10 = ((long)puVar4 - (long)puVar1 >> 3) + ((long)puVar2 - lVar6 >> 3);
    local_50._M_cur = puVar1;
    local_50._M_first = puVar3;
    local_50._M_last = puVar4;
    local_50._M_node = ppuVar5;
    std::
    _Temporary_buffer<std::_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
    ::_Temporary_buffer(&local_c0,&local_50,
                        ((lVar10 + lVar9) - (lVar9 + lVar10 + 1 >> 0x3f)) + 1 >> 1);
    local_90 = puVar2;
    local_88 = lVar6;
    local_80 = uVar7;
    local_78 = lVar8;
    local_70 = puVar1;
    local_68 = puVar3;
    local_60 = puVar4;
    local_58 = ppuVar5;
    if (local_c0._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<std::_Deque_iterator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>&,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*>,__gnu_cxx::__ops::_Iter_comp_iter<helics::__5>>
                ();
    }
    else {
      std::
      __stable_sort_adaptive<std::_Deque_iterator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>&,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*>,std::unique_ptr<helics::Message,std::default_delete<helics::Message>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<helics::__5>>
                ();
    }
    std::
    _Temporary_buffer<std::_Deque_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_&,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
    ::~_Temporary_buffer(&local_c0);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_a0);
  return;
}

Assistant:

void EndpointInfo::addMessage(std::unique_ptr<Message> message)
{
    auto handle = message_queue.lock();
    handle->push_back(std::move(message));
    std::stable_sort(handle->begin(), handle->end(), msgSorter);
}